

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O2

int Wln_ObjIsCio(Wln_Ntk_t *p,int i)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Vec_IntEntry(&p->vTypes,i);
  if (iVar1 == 3) {
    uVar2 = 1;
  }
  else {
    iVar1 = Vec_IntEntry(&p->vTypes,i);
    uVar2 = (uint)(iVar1 == 4);
  }
  return uVar2;
}

Assistant:

static inline int          Wln_ObjIsCio( Wln_Ntk_t * p, int i )                  { return Wln_ObjType(p, i) == ABC_OPER_CI || Wln_ObjType(p, i)==ABC_OPER_CO; }